

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readBitsFromReversedStream(size_t *bitpointer,uchar *bitstream,size_t nbits)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = 0;
  while (bVar3 = nbits != 0, nbits = nbits - 1, bVar3) {
    bVar1 = readBitFromReversedStream(bitpointer,bitstream);
    uVar2 = (uint)bVar1 + uVar2 * 2;
  }
  return uVar2;
}

Assistant:

static unsigned readBitsFromReversedStream(size_t* bitpointer, const unsigned char* bitstream, size_t nbits)
{
  unsigned result = 0;
  size_t i;
  for(i = 0 ; i < nbits; ++i)
  {
    result <<= 1;
    result |= (unsigned)readBitFromReversedStream(bitpointer, bitstream);
  }
  return result;
}